

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<int>::resolve<int_const&>(PromiseData<int> *this,int *value)

{
  PromiseValue<int> local_28;
  int *local_18;
  int *value_local;
  PromiseData<int> *this_local;
  
  local_18 = value;
  value_local = (int *)this;
  PromiseValue<int>::PromiseValue(&local_28,value);
  PromiseValue<int>::operator=(&this->m_value,&local_28);
  PromiseValue<int>::~PromiseValue(&local_28);
  PromiseDataBase<int,_void_(const_int_&)>::setSettled
            (&this->super_PromiseDataBase<int,_void_(const_int_&)>);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }